

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

uint __thiscall
Js::WebAssemblyModule::AddGlobalByteSizeToOffset
          (WebAssemblyModule *this,WasmType type,uint32 offset)

{
  uint32 uVar1;
  uint lhs;
  uint32 sizeUsed;
  uint32 typeSize;
  uint32 offset_local;
  WasmType type_local;
  WebAssemblyModule *this_local;
  
  uVar1 = Wasm::WasmTypes::GetTypeByteSize(type);
  lhs = ::Math::AlignOverflowCheck<unsigned_int>(offset,uVar1);
  uVar1 = WAsmJs::ConvertOffset<unsigned_char>(this->m_globalCounts[type],uVar1);
  uVar1 = UInt32Math::Add(lhs,uVar1);
  return uVar1;
}

Assistant:

uint
WebAssemblyModule::AddGlobalByteSizeToOffset(Wasm::WasmTypes::WasmType type, uint32 offset) const
{
    uint32 typeSize = Wasm::WasmTypes::GetTypeByteSize(type);
    offset = ::Math::AlignOverflowCheck(offset, typeSize);
    uint32 sizeUsed = WAsmJs::ConvertOffset<byte>(m_globalCounts[type], typeSize);
    return UInt32Math::Add(offset, sizeUsed);
}